

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O3

void language::formatMemberFnPtr(QTextStream *str,SignalSlot *s,OverloadUse useQOverload)

{
  char16_t *pcVar1;
  ulong originalLength;
  long lVar2;
  storage_type_conflict *psVar3;
  storage_type_conflict *psVar4;
  char cVar5;
  CutResult CVar6;
  ulong uVar7;
  QTextStream *pQVar8;
  qsizetype qVar9;
  long lVar10;
  char *pcVar11;
  QChar QVar12;
  qsizetype qVar13;
  ulong uVar14;
  QArrayData *pQVar15;
  char16_t *pcVar16;
  long lVar17;
  long in_FS_OFFSET;
  QByteArrayView QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QString result;
  QString local_88;
  QArrayData *local_68;
  char16_t *local_60;
  QStringView local_58;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.m_data = (s->signature).d.ptr;
  local_58.m_size = (s->signature).d.size;
  uVar7 = QStringView::indexOf(&local_58,(QChar)0x28,0,CaseSensitive);
  pcVar1 = (s->signature).d.ptr;
  originalLength = (s->signature).d.size;
  uVar14 = uVar7;
  if (originalLength < uVar7) {
    uVar14 = originalLength;
  }
  local_58.m_size = uVar7 + 1;
  local_88.d.d = (Data *)((originalLength - uVar7) + -2);
  CVar6 = QtPrivate::QContainerImplHelper::mid
                    (originalLength,&local_58.m_size,(qsizetype *)&local_88);
  pQVar15 = (QArrayData *)0x0;
  if (CVar6 != Null) {
    pQVar15 = &(local_88.d.d)->super_QArrayData;
  }
  if ((useQOverload == WhenAmbiguousOrEmpty) &&
     (pQVar15 == (QArrayData *)0x0 ||
      ((s->options).super_QFlagsStorageHelper<language::SignalSlotOption,_4>.
       super_QFlagsStorage<language::SignalSlotOption>.i & 1) != 0)) {
    pcVar16 = (char16_t *)0x0;
    if (CVar6 != Null) {
      pcVar16 = pcVar1 + local_58.m_size;
    }
    QVar18.m_data = (storage_type *)0xa;
    QVar18.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar18);
    local_88.d.d = (Data *)local_58.m_size;
    local_88.d.ptr = local_58.m_data;
    local_88.d.size = (qsizetype)local_48;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = pQVar15;
    local_60 = pcVar16;
    QStringView::split(&local_58,&local_68,0x2c,0,1);
    if (local_48 != (undefined1 *)0x0) {
      lVar10 = (long)local_48 << 4;
      lVar17 = 0;
      do {
        psVar4 = local_58.m_data;
        QVar12.ucs = (char16_t)&local_88;
        if (lVar17 != 0) {
          QString::append(QVar12);
        }
        lVar2 = *(long *)((long)psVar4 + lVar17);
        psVar3 = *(storage_type_conflict **)((long)psVar4 + lVar17 + 8);
        if ((lVar2 == 0) || (*psVar3 != L'Q')) {
LAB_00152f0a:
          QString::append((QChar *)&local_88,(longlong)psVar3);
        }
        else {
          if (lVar2 == 6) {
            qVar13 = 6;
            qVar9 = 6;
            pcVar11 = "QPoint";
LAB_00152efe:
            QVar19.m_data = pcVar11;
            QVar19.m_size = qVar13;
            QVar21.m_data = psVar3;
            QVar21.m_size = qVar9;
            cVar5 = QtPrivate::equalStrings(QVar19,QVar21);
            if (cVar5 != '\0') goto LAB_00152f0a;
          }
          else if (lVar2 == 5) {
            qVar13 = 5;
            qVar9 = 5;
            pcVar11 = "QSize";
            goto LAB_00152efe;
          }
          QVar20.m_data = &DAT_00000006;
          QVar20.m_size = (qsizetype)&local_88;
          QString::append(QVar20);
          QString::append((QChar *)&local_88,*(longlong *)((long)psVar4 + lVar17 + 8));
          QString::append(QVar12);
        }
        lVar17 = lVar17 + 0x10;
      } while (lVar10 != lVar17);
    }
    QString::append((QChar)(char16_t)&local_88);
    if ((QArrayData *)local_58.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58.m_size,0x10,0x10);
      }
    }
    pQVar8 = (QTextStream *)QTextStream::operator<<(str,&local_88);
    QTextStream::operator<<(pQVar8,'(');
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar8 = (QTextStream *)QTextStream::operator<<(str,'&');
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,&s->className);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,"::");
    QVar22.m_data = pcVar1;
    QVar22.m_size = uVar14;
    QTextStream::operator<<(pQVar8,QVar22);
    QTextStream::operator<<(str,')');
  }
  else {
    pQVar8 = (QTextStream *)QTextStream::operator<<(str,'&');
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,&s->className);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,"::");
    QVar23.m_data = pcVar1;
    QVar23.m_size = uVar14;
    QTextStream::operator<<(pQVar8,QVar23);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void formatMemberFnPtr(QTextStream &str, const SignalSlot &s, OverloadUse useQOverload)
{
    const qsizetype parenPos = s.signature.indexOf(u'(');
    Q_ASSERT(parenPos >= 0);
    const auto functionName = QStringView{s.signature}.left(parenPos);

    const auto parameters = QStringView{s.signature}.mid(parenPos + 1,
                                               s.signature.size() - parenPos - 2);

    const bool isAmbiguous = s.options.testFlag(SignalSlotOption::Ambiguous);
    bool withOverload = false; // just to silence the compiler

    switch (useQOverload) {
    case OverloadUse::Always:
        withOverload = true;
        break;
    case OverloadUse::Never:
        withOverload = false;
        break;
    case OverloadUse::WhenAmbiguousOrEmpty:
        withOverload = parameters.empty() || isAmbiguous;
        break;
    }

    if (withOverload)
        str << formatOverload(parameters) << '(';

    str << '&' << s.className << "::" << functionName;

    if (withOverload)
        str << ')';
}